

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O2

int VP8EncDeleteAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  
  if (enc->thread_level < 1) {
    iVar1 = 1;
  }
  else {
    pWVar2 = WebPGetWorkerInterface();
    iVar1 = (*pWVar2->Sync)(&enc->alpha_worker);
    pWVar2 = WebPGetWorkerInterface();
    (*pWVar2->End)(&enc->alpha_worker);
  }
  WebPSafeFree(enc->alpha_data);
  *(undefined8 *)&enc->has_alpha = 0;
  *(undefined8 *)((long)&enc->alpha_data + 4) = 0;
  return iVar1;
}

Assistant:

int VP8EncDeleteAlpha(VP8Encoder* const enc) {
  int ok = 1;
  if (enc->thread_level > 0) {
    WebPWorker* const worker = &enc->alpha_worker;
    // finish anything left in flight
    ok = WebPGetWorkerInterface()->Sync(worker);
    // still need to end the worker, even if !ok
    WebPGetWorkerInterface()->End(worker);
  }
  WebPSafeFree(enc->alpha_data);
  enc->alpha_data = NULL;
  enc->alpha_data_size = 0;
  enc->has_alpha = 0;
  return ok;
}